

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_net.cpp
# Opt level: O0

void __thiscall TicSpecial::~TicSpecial(TicSpecial *this)

{
  int local_14;
  int i;
  TicSpecial *this_local;
  
  for (local_14 = 0; local_14 < 0x24; local_14 = local_14 + 1) {
    if (this->streams[local_14] != (BYTE *)0x0) {
      M_Free(this->streams[local_14]);
      this->streams[local_14] = (BYTE *)0x0;
      this->used[local_14] = 0;
    }
  }
  this->okay = false;
  return;
}

Assistant:

~TicSpecial ()
	{
		int i;

		for (i = 0; i < BACKUPTICS; i++)
		{
			if (streams[i])
			{
				M_Free (streams[i]);
				streams[i] = NULL;
				used[i] = 0;
			}
		}
		okay = false;
	}